

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_x_on_curve_var(secp256k1_fe *x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  bool bVar48;
  int iVar49;
  int extraout_EAX;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  secp256k1_fe *r;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_fe c;
  uchar auStack_e0 [40];
  secp256k1_fe *psStack_b8;
  secp256k1_fe local_60;
  
  r = x;
  secp256k1_fe_verify(x);
  if (x->magnitude < 9) {
    uVar53 = x->n[0];
    uVar55 = x->n[1];
    uVar1 = x->n[2];
    uVar2 = x->n[3];
    uVar3 = x->n[4];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar53 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar55 * 2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar3;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    uVar50 = SUB168(auVar7 * auVar27,0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar50 & 0xfffffffffffff;
    auVar5 = auVar6 * auVar26 + auVar5 * auVar25 + auVar8 * ZEXT816(0x1000003d10);
    uVar51 = auVar5._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar51 >> 0x34 | auVar5._8_8_ << 0xc;
    uVar3 = uVar3 * 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar53;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar3;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar55 * 2;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar2;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar1;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar1;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar50 >> 0x34 | SUB168(auVar7 * auVar27,8) << 0xc;
    auVar5 = auVar9 * auVar28 + auVar41 + auVar10 * auVar29 + auVar11 * auVar30 +
             auVar12 * ZEXT816(0x1000003d10);
    uVar50 = auVar5._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar50 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar53;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar53;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar55;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar3;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar1 * 2;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar2;
    auVar5 = auVar14 * auVar32 + auVar42 + auVar15 * auVar33;
    uVar52 = auVar5._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar52 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (uVar52 & 0xfffffffffffff) << 4 | (uVar50 & 0xfffffffffffff) >> 0x30;
    auVar5 = auVar13 * auVar31 + ZEXT816(0x1000003d1) * auVar34;
    uVar52 = auVar5._0_8_;
    local_60.n[0] = uVar52 & 0xfffffffffffff;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar52 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar53 * 2;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar55;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar1;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar3;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar2;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar2;
    auVar6 = auVar17 * auVar36 + auVar44 + auVar18 * auVar37;
    uVar52 = auVar6._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar52 & 0xfffffffffffff;
    auVar5 = auVar16 * auVar35 + auVar43 + auVar19 * ZEXT816(0x1000003d10);
    uVar54 = auVar5._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar52 >> 0x34 | auVar6._8_8_ << 0xc;
    local_60.n[1] = uVar54 & 0xfffffffffffff;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar54 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar53 * 2;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar1;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar55;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar55;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar2;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar3;
    auVar46 = auVar22 * auVar40 + auVar46;
    uVar53 = auVar46._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar53 & 0xfffffffffffff;
    auVar5 = auVar20 * auVar38 + auVar45 + auVar21 * auVar39 + auVar23 * ZEXT816(0x1000003d10);
    uVar55 = auVar5._0_8_;
    local_60.n[2] = uVar55 & 0xfffffffffffff;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = (uVar55 >> 0x34 | auVar5._8_8_ << 0xc) + (uVar51 & 0xfffffffffffff);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar53 >> 0x34 | auVar46._8_8_ << 0xc;
    auVar47 = auVar24 * ZEXT816(0x1000003d10) + auVar47;
    uVar53 = auVar47._0_8_;
    local_60.n[3] = uVar53 & 0xfffffffffffff;
    local_60.n[4] = (uVar53 >> 0x34 | auVar47._8_8_ << 0xc) + (uVar50 & 0xffffffffffff);
    local_60.magnitude = 1;
    local_60.normalized = 0;
    secp256k1_fe_verify(&local_60);
    secp256k1_fe_mul(&local_60,&local_60,x);
    secp256k1_fe_verify(&local_60);
    local_60.n[0] = local_60.n[0] + 7;
    local_60.normalized = 0;
    local_60.magnitude = local_60.magnitude + 1;
    secp256k1_fe_verify(&local_60);
    iVar49 = secp256k1_fe_is_square_var(&local_60);
    return iVar49;
  }
  secp256k1_ge_x_on_curve_var_cold_1();
  psStack_b8 = x;
  do {
    secp256k1_testrand_bytes_test(auStack_e0,0x20);
    secp256k1_fe_impl_set_b32_mod(r,auStack_e0);
    uVar53 = r->n[4] ^ 0xffffffffffff;
    bVar48 = (r->n[2] & r->n[3] & r->n[1]) == 0xfffffffffffff;
    bVar56 = bVar48 && uVar53 == 0;
    iVar49 = (int)CONCAT71((int7)(uVar53 >> 8),bVar56);
    bVar4 = 0xffffefffffc2e < r->n[0];
    if (bVar4 && (bVar48 && uVar53 == 0)) {
      r->magnitude = -1;
    }
    else {
      r->magnitude = 1;
      r->normalized = 1;
      secp256k1_fe_verify(r);
      iVar49 = extraout_EAX;
    }
  } while (bVar4 && bVar56);
  return iVar49;
}

Assistant:

static int secp256k1_ge_x_on_curve_var(const secp256k1_fe *x) {
    secp256k1_fe c;
    secp256k1_fe_sqr(&c, x);
    secp256k1_fe_mul(&c, &c, x);
    secp256k1_fe_add_int(&c, SECP256K1_B);
    return secp256k1_fe_is_square_var(&c);
}